

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

void aiAttachLogStream(aiLogStream *stream)

{
  bool bVar1;
  LogToCallbackRedirector *this;
  mapped_type *ppLVar2;
  Logger *pLVar3;
  size_t in_RSI;
  LogStream *lg;
  aiLogStream *stream_local;
  
  this = (LogToCallbackRedirector *)
         Assimp::Intern::AllocateFromAssimpHeap::operator_new((AllocateFromAssimpHeap *)0x18,in_RSI)
  ;
  LogToCallbackRedirector::LogToCallbackRedirector(this,stream);
  ppLVar2 = std::
            map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
            ::operator[]((map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
                          *)Assimp::gActiveLogStreams,stream);
  *ppLVar2 = (mapped_type)this;
  bVar1 = Assimp::DefaultLogger::isNullLogger();
  if (bVar1) {
    Assimp::DefaultLogger::create
              ((char *)0x0,(uint)(Assimp::gVerboseLogging == 1),9,(IOSystem *)0x0);
  }
  pLVar3 = Assimp::DefaultLogger::get();
  (*pLVar3->_vptr_Logger[2])(pLVar3,this,0xf);
  return;
}

Assistant:

ASSIMP_API void aiAttachLogStream( const aiLogStream* stream )
{
    ASSIMP_BEGIN_EXCEPTION_REGION();

#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif

    LogStream* lg = new LogToCallbackRedirector(*stream);
    gActiveLogStreams[*stream] = lg;

    if (DefaultLogger::isNullLogger()) {
        DefaultLogger::create(NULL,(gVerboseLogging == AI_TRUE ? Logger::VERBOSE : Logger::NORMAL));
    }
    DefaultLogger::get()->attachStream(lg);
    ASSIMP_END_EXCEPTION_REGION(void);
}